

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

uint32_t inform_dist_set(inform_dist *dist,size_t event,uint32_t x)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if ((dist != (inform_dist *)0x0) && (uVar1 = 0, event < dist->size)) {
    dist->counts = dist->counts + ((ulong)x - (ulong)dist->histogram[event]);
    dist->histogram[event] = x;
    uVar1 = x;
  }
  return uVar1;
}

Assistant:

uint32_t inform_dist_set(inform_dist *dist, size_t event, uint32_t x)
{
    // if the distribution is NULL or the event is outsize of the support
    if (dist == NULL || event >= dist->size)
    {
        return 0;
    }
    // otherwise decrement counts by the old number of occurances
    dist->counts -= dist->histogram[event];
    // increment counts by the new number of occurances
    dist->counts += x;
    // set and return the new number of occurances of the event
    return (dist->histogram[event] = x);
}